

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O0

shared_ptr<QPDFJob::PagesConfig> __thiscall QPDFJob::Config::pages(Config *this)

{
  bool bVar1;
  element_type *peVar2;
  PagesConfig *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Config *in_RSI;
  shared_ptr<QPDFJob::PagesConfig> sVar3;
  allocator<char> local_39;
  string local_38;
  Config *this_local;
  
  this_local = this;
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RSI->o);
  bVar1 = std::vector<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>::empty
                    (&peVar2->page_specs);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"--pages may only be specified one time",&local_39);
    usage(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  this_00 = (PagesConfig *)operator_new(8);
  PagesConfig::PagesConfig(this_00,in_RSI);
  std::shared_ptr<QPDFJob::PagesConfig>::shared_ptr<QPDFJob::PagesConfig,void>
            ((shared_ptr<QPDFJob::PagesConfig> *)this,this_00);
  sVar3.super___shared_ptr<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<QPDFJob::PagesConfig>)
         sVar3.super___shared_ptr<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<QPDFJob::PagesConfig>
QPDFJob::Config::pages()
{
    if (!o.m->page_specs.empty()) {
        usage("--pages may only be specified one time");
    }
    return std::shared_ptr<PagesConfig>(new PagesConfig(this));
}